

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O0

String * __thiscall luna::State::GetString(State *this,char *str)

{
  String *str_00;
  String *in_RSI;
  StringPool *in_RDI;
  GC *unaff_retaddr;
  String *s;
  char *in_stack_ffffffffffffffd8;
  StringPool *str_01;
  
  str_01 = in_RDI;
  std::unique_ptr<luna::StringPool,_std::default_delete<luna::StringPool>_>::operator->
            ((unique_ptr<luna::StringPool,_std::default_delete<luna::StringPool>_> *)0x1eed71);
  str_00 = StringPool::GetString(in_RDI,in_stack_ffffffffffffffd8);
  if (str_00 == (String *)0x0) {
    std::unique_ptr<luna::GC,_std::default_delete<luna::GC>_>::operator->
              ((unique_ptr<luna::GC,_std::default_delete<luna::GC>_> *)0x1eed99);
    str_00 = GC::NewString(unaff_retaddr,(GCGeneration)((ulong)str_01 >> 0x20));
    String::SetValue(in_RSI,(char *)str_00);
    std::unique_ptr<luna::StringPool,_std::default_delete<luna::StringPool>_>::operator->
              ((unique_ptr<luna::StringPool,_std::default_delete<luna::StringPool>_> *)0x1eedc5);
    StringPool::AddString((StringPool *)unaff_retaddr,&str_01->temp_);
  }
  return str_00;
}

Assistant:

String * State::GetString(const char *str)
    {
        auto s = string_pool_->GetString(str);
        if (!s)
        {
            s = gc_->NewString();
            s->SetValue(str);
            string_pool_->AddString(s);
        }
        return s;
    }